

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

char * vkb::to_string_message_type(VkDebugUtilsMessageTypeFlagsEXT s)

{
  char *pcStack_10;
  VkDebugUtilsMessageTypeFlagsEXT s_local;
  
  if (s == 7) {
    pcStack_10 = "General | Validation | Performance";
  }
  else if (s == 6) {
    pcStack_10 = "Validation | Performance";
  }
  else if (s == 5) {
    pcStack_10 = "General | Performance";
  }
  else if (s == 4) {
    pcStack_10 = "Performance";
  }
  else if (s == 3) {
    pcStack_10 = "General | Validation";
  }
  else if (s == 2) {
    pcStack_10 = "Validation";
  }
  else if (s == 1) {
    pcStack_10 = "General";
  }
  else {
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

const char* to_string_message_type(VkDebugUtilsMessageTypeFlagsEXT s) {
    if (s == 7) return "General | Validation | Performance";
    if (s == 6) return "Validation | Performance";
    if (s == 5) return "General | Performance";
    if (s == 4 /*VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT*/) return "Performance";
    if (s == 3) return "General | Validation";
    if (s == 2 /*VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT*/) return "Validation";
    if (s == 1 /*VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT*/) return "General";
    return "Unknown";
}